

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O3

vector<Lit,_std::allocator<Lit>_> * __thiscall
GraphPropagator::fullExpl
          (vector<Lit,_std::allocator<Lit>_> *__return_storage_ptr__,GraphPropagator *this,bool fail
          )

{
  uint uVar1;
  iterator iVar2;
  uint uVar3;
  int iVar4;
  undefined8 in_RAX;
  undefined7 in_register_00000011;
  long lVar5;
  long lVar6;
  undefined8 local_38;
  
  (__return_storage_ptr__->super__Vector_base<Lit,_std::allocator<Lit>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Lit,_std::allocator<Lit>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Lit,_std::allocator<Lit>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38 = in_RAX;
  if ((int)CONCAT71(in_register_00000011,fail) == 0) {
    std::vector<Lit,_std::allocator<Lit>_>::_M_realloc_insert<>
              (__return_storage_ptr__,(iterator)0x0);
  }
  uVar3 = (this->vs).sz;
  if (0 < (int)uVar3) {
    lVar5 = 8;
    lVar6 = 0;
    do {
      uVar1 = *(uint *)((long)&(((this->vs).data)->super_Var).super_Branching._vptr_Branching +
                       lVar5);
      if (sat.assigns.data[uVar1] != 0) {
        iVar4 = (uint)((byte)sat.assigns.data[uVar1] < 0xfe) + uVar1 * 2;
        local_38 = CONCAT44(iVar4,local_38._0_4_);
        iVar2._M_current =
             (__return_storage_ptr__->super__Vector_base<Lit,_std::allocator<Lit>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (__return_storage_ptr__->super__Vector_base<Lit,_std::allocator<Lit>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<Lit,_std::allocator<Lit>_>::_M_realloc_insert<Lit>
                    (__return_storage_ptr__,iVar2,(Lit *)((long)&local_38 + 4));
        }
        else {
          (iVar2._M_current)->x = iVar4;
          (__return_storage_ptr__->super__Vector_base<Lit,_std::allocator<Lit>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar2._M_current + 1;
        }
        uVar3 = (this->vs).sz;
      }
      lVar6 = lVar6 + 1;
      lVar5 = lVar5 + 0x10;
    } while (lVar6 < (int)uVar3);
  }
  uVar3 = (this->es).sz;
  if (0 < (int)uVar3) {
    lVar5 = 8;
    lVar6 = 0;
    do {
      uVar1 = *(uint *)((long)&(((this->es).data)->super_Var).super_Branching._vptr_Branching +
                       lVar5);
      if (sat.assigns.data[uVar1] != 0) {
        iVar4 = (uint)((byte)sat.assigns.data[uVar1] < 0xfe) + uVar1 * 2;
        local_38 = CONCAT44(local_38._4_4_,iVar4);
        iVar2._M_current =
             (__return_storage_ptr__->super__Vector_base<Lit,_std::allocator<Lit>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (__return_storage_ptr__->super__Vector_base<Lit,_std::allocator<Lit>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<Lit,_std::allocator<Lit>_>::_M_realloc_insert<Lit>
                    (__return_storage_ptr__,iVar2,(Lit *)&local_38);
        }
        else {
          (iVar2._M_current)->x = iVar4;
          (__return_storage_ptr__->super__Vector_base<Lit,_std::allocator<Lit>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar2._M_current + 1;
        }
        uVar3 = (this->es).sz;
      }
      lVar6 = lVar6 + 1;
      lVar5 = lVar5 + 0x10;
    } while (lVar6 < (int)uVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Lit> GraphPropagator::fullExpl(bool fail) {
	std::vector<Lit> ps;
	if (!fail) {
		ps.emplace_back();
	}
	for (int i = 0; i < nbNodes(); i++) {
		if (getNodeVar(i).isFixed()) {
			ps.push_back(getNodeVar(i).getValLit());
		}
	}
	for (int i = 0; i < nbEdges(); i++) {
		if (getEdgeVar(i).isFixed()) {
			ps.push_back(getEdgeVar(i).getValLit());
		}
	}
	return ps;
}